

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avi_rw.cpp
# Opt level: O1

void read_rec(FILE *file,uint32_t bytes,AVIMaker *aviMaker)

{
  uint32_t uVar1;
  bool bVar2;
  uint32_t uVar3;
  Chunk chunk;
  uint32_t node;
  uint32_t local_40 [4];
  
  local_40[1] = 0;
  local_40[2] = 0;
  if (bytes != 0) {
    local_40[0] = bytes;
    do {
      uVar1 = local_40[0];
      fread(local_40 + 3,4,1,(FILE *)file);
      uVar3 = local_40[3];
      local_40[0] = uVar1 - 4;
      bVar2 = read_data(file,local_40[3],local_40,aviMaker);
      if (!bVar2) {
        if (uVar3 == 0x4b4e554a) {
          local_40[1] = 0x4b4e554a;
        }
        else {
          if (uVar3 != 0x74646576) goto LAB_001098d3;
          local_40[1] = 0x74646576;
        }
        fread(local_40 + 2,4,1,(FILE *)file);
        uVar1 = local_40[2];
        uVar3 = local_40[0] - 4;
        local_40[0] = uVar3;
        fseek((FILE *)file,(long)(int)local_40[2],1);
        local_40[0] = uVar3 - uVar1;
      }
LAB_001098d3:
    } while (local_40[0] != 0);
  }
  return;
}

Assistant:

void read_rec(FILE *file, uint32_t bytes, AVIMaker *aviMaker) {
    uint32_t node;
    Chunk chunk;
    while (bytes > 0) {
        node = read_node(file, bytes);
        if (read_data(file, node, bytes, aviMaker)) continue;
        switch (node) {
            case VEDT:
                //bytes -= CHUNK_SIZE;
                read_chunk(file, chunk, node, bytes);
                //TRACE print_chunk(chunk);
                skip(file, chunk.ckSize, bytes);
                //bytes -= chunk.ckSize;
                break;
            case JUNK:
                //bytes -= CHUNK_SIZE;
                read_chunk(file, chunk, node, bytes);
                //TRACE print_chunk(chunk);
                skip(file, chunk.ckSize, bytes);
                //bytes -= chunk.ckSize;
                break;
            default:
                int x;
                //std::cin >> x;
                //TRACE printf("unknow fourcc rec - ");
                //TRACE print_fourcc(node);
                //TRACE printf("- 0x%x\n", node);
                break;
        };
        //printf("bytes: %d\n", bytes);
        //std::cin >> x;
    }
}